

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.h
# Opt level: O1

void __thiscall
pbrt::PixelSensor::PixelSensor
          (PixelSensor *this,SpectrumHandle *r,SpectrumHandle *g,SpectrumHandle *b,
          RGBColorSpace *outputColorSpace,Float wbTemp,Float imagingRatio,Allocator alloc)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  int i;
  long lVar4;
  long lVar5;
  PixelSensor *pPVar6;
  size_t i_2;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  *spec;
  ulong uVar7;
  int i_1;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  TVar8;
  Float *pFVar9;
  int iVar10;
  DenselySampledSpectrum *pDVar11;
  undefined1 auVar12 [12];
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar31 [56];
  undefined1 extraout_var [60];
  undefined1 auVar29 [64];
  Float FVar32;
  float fVar33;
  RGB RVar34;
  XYZ XVar35;
  uintptr_t iptr;
  optional<pbrt::SquareMatrix<3>_> m;
  DenselySampledSpectrum sensorIllum;
  Float rgbCamera [24] [3];
  Float xyzOutput [24] [3];
  DispatchSplit<7> local_351;
  Float local_350;
  float local_34c;
  PixelSensor *local_348;
  Float local_33c;
  DenselySampledSpectrum *local_338;
  ulong local_330;
  float local_324;
  aligned_storage_t<sizeof(pbrt::SquareMatrix<3>),_alignof(pbrt::SquareMatrix<3>)> local_320;
  char local_2fc;
  RGBColorSpace *local_2f8;
  SpectrumHandle local_2f0;
  SpectrumHandle local_2e8;
  SpectrumHandle local_2e0;
  SpectrumHandle local_2d8;
  SpectrumHandle local_2d0;
  SpectrumHandle local_2c8;
  SpectrumHandle local_2c0;
  SpectrumHandle local_2b8;
  SpectrumHandle local_2b0;
  SpectrumHandle local_2a8;
  DenselySampledSpectrum local_2a0;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  local_278 [36];
  Float local_158 [74];
  undefined1 auVar36 [36];
  undefined1 auVar30 [64];
  undefined1 extraout_var_00 [60];
  
  lVar4 = 0;
  auVar13 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
  auVar14 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
  pPVar6 = this;
  do {
    auVar15 = vpbroadcastq_avx512f();
    uVar1 = vpcmpeqq_avx512f(auVar15,auVar13);
    uVar2 = vpcmpeqq_avx512f(auVar15,auVar14);
    auVar15 = vpmovm2d_avx512dq((ulong)CONCAT11((char)uVar2,(char)uVar1));
    auVar15 = vpsrld_avx512f(auVar15,0x1f);
    auVar15 = vcvtdq2ps_avx512f(auVar15);
    iVar10 = (pPVar6->r_bar).lambda_min;
    iVar3 = (pPVar6->r_bar).lambda_max;
    auVar12 = auVar15._0_12_;
    uVar16 = (pPVar6->XYZFromSensorRGB).m[1][0];
    auVar36._12_4_ = uVar16;
    auVar36._0_12_ = auVar12;
    uVar17 = (pPVar6->XYZFromSensorRGB).m[1][1];
    auVar36._16_4_ = uVar17;
    uVar18 = (pPVar6->XYZFromSensorRGB).m[1][2];
    auVar36._20_4_ = uVar18;
    uVar19 = (pPVar6->XYZFromSensorRGB).m[2][0];
    auVar36._24_4_ = uVar19;
    uVar20 = (pPVar6->XYZFromSensorRGB).m[2][1];
    auVar36._28_4_ = uVar20;
    uVar21 = (pPVar6->XYZFromSensorRGB).m[2][2];
    auVar36._32_4_ = uVar21;
    uVar22 = *(undefined4 *)&pPVar6->field_0x24;
    auVar15._36_4_ = uVar22;
    auVar15._0_36_ = auVar36;
    uVar23 = iVar10;
    auVar15._40_4_ = uVar23;
    uVar24 = iVar3;
    auVar15._44_4_ = uVar24;
    uVar25 = *(undefined4 *)&(pPVar6->r_bar).values.alloc.memoryResource;
    auVar15._48_4_ = uVar25;
    uVar26 = *(undefined4 *)((long)&(pPVar6->r_bar).values.alloc.memoryResource + 4);
    auVar15._52_4_ = uVar26;
    auVar15._56_4_ = *(undefined4 *)&(pPVar6->r_bar).values.ptr;
    auVar15._60_4_ = *(undefined4 *)((long)&(pPVar6->r_bar).values.ptr + 4);
    pPVar6->XYZFromSensorRGB = (SquareMatrix<3>)auVar36;
    *(undefined4 *)&pPVar6->field_0x24 = *(undefined4 *)&pPVar6->field_0x24;
    (pPVar6->r_bar).lambda_min = iVar10;
    (pPVar6->r_bar).lambda_max = iVar3;
    (pPVar6->r_bar).values.alloc = (polymorphic_allocator<float>)auVar15._48_8_;
    (pPVar6->r_bar).values.ptr = (float *)auVar15._56_8_;
    lVar4 = lVar4 + 1;
    pPVar6 = (PixelSensor *)((pPVar6->XYZFromSensorRGB).m + 1);
  } while (lVar4 != 3);
  local_278[0].bits =
       (r->
       super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
       ).bits;
  local_350 = imagingRatio;
  local_2f8 = outputColorSpace;
  DenselySampledSpectrum::DenselySampledSpectrum
            (&this->r_bar,(SpectrumHandle *)local_278,0x168,0x33e,alloc);
  local_338 = &this->g_bar;
  local_278[0].bits =
       (g->
       super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
       ).bits;
  DenselySampledSpectrum::DenselySampledSpectrum
            (local_338,(SpectrumHandle *)local_278,0x168,0x33e,alloc);
  local_278[0].bits =
       (b->
       super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
       ).bits;
  spec = local_278;
  DenselySampledSpectrum::DenselySampledSpectrum
            (&this->b_bar,(SpectrumHandle *)spec,0x168,0x33e,alloc);
  this->imagingRatio = local_350;
  auVar13 = ZEXT464((uint)wbTemp);
  local_348 = this;
  Spectra::D(&local_2a0,wbTemp,alloc);
  TVar8.bits = (ulong)local_338 | 0x2000000000000;
  lVar4 = 0;
  do {
    auVar31 = auVar13._8_56_;
    local_2a8.
    super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
    .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
             )(&swatchReflectances)[lVar4];
    local_2c8.
    super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
    .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
             )(TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
               )((ulong)&this->b_bar | 0x2000000000000);
    local_2c0.
    super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
    .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
             )(TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
               )TVar8.bits;
    local_2b8.
    super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
    .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
             )(TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
               )((ulong)&this->r_bar | 0x2000000000000);
    local_2b0.
    super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
    .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
             )(TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
               )((ulong)&local_2a0 | 0x2000000000000);
    RVar34 = ProjectReflectance<pbrt::RGB>(&local_2a8,&local_2b0,&local_2b8,&local_2c0,&local_2c8);
    auVar13._0_8_ = RVar34._0_8_;
    auVar13._8_56_ = auVar31;
    auVar28 = vmovshdup_avx(auVar13._0_16_);
    lVar5 = 0;
    do {
      FVar32 = RVar34.r;
      if (((int)lVar5 != 0) && (FVar32 = auVar28._0_4_, (int)lVar5 != 1)) {
        FVar32 = RVar34.b;
      }
      *(Float *)((long)&((TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
                          *)&spec->bits)->bits + lVar5 * 4) = FVar32;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 3);
    lVar4 = lVar4 + 1;
    spec = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
            *)((long)&((TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
                        *)&spec[1].bits)->bits + 4);
  } while (lVar4 != 0x18);
  uVar7 = (ulong)&local_2a0 | 0x2000000000000;
  local_338 = (DenselySampledSpectrum *)((ulong)local_338 | 0x2000000000000);
  local_330 = (ulong)local_338 >> 0x30;
  auVar28 = ZEXT816(0) << 0x40;
  iVar10 = 0x168;
  do {
    local_350 = auVar28._0_4_;
    local_34c = (float)iVar10;
    local_320._0_8_ = uVar7;
    local_33c = DispatchSplit<7>::operator()(&local_351,&local_34c,&local_320,uVar7 >> 0x30);
    local_320._0_8_ = local_338;
    local_34c = (float)iVar10;
    auVar14._0_4_ = DispatchSplit<7>::operator()(&local_351,&local_34c,&local_320,local_330);
    auVar14._4_60_ = extraout_var;
    auVar28 = vfmadd231ss_fma(ZEXT416((uint)local_350),auVar14._0_16_,ZEXT416((uint)local_33c));
    iVar10 = iVar10 + 1;
  } while (iVar10 != 0x33f);
  local_324 = auVar28._0_4_ / 106.856895;
  local_338 = (DenselySampledSpectrum *)(Spectra::y | 0x2000000000000);
  local_330 = (ulong)local_338 >> 0x30;
  auVar28 = ZEXT816(0) << 0x20;
  iVar10 = 0x168;
  do {
    local_350 = auVar28._0_4_;
    local_34c = (float)iVar10;
    local_320._0_8_ = uVar7;
    local_33c = DispatchSplit<7>::operator()(&local_351,&local_34c,&local_320,uVar7 >> 0x30);
    local_320._0_8_ = local_338;
    local_34c = (float)iVar10;
    auVar29._0_4_ = DispatchSplit<7>::operator()(&local_351,&local_34c,&local_320,local_330);
    auVar29._4_60_ = extraout_var_00;
    auVar28 = vfmadd231ss_fma(ZEXT416((uint)local_350),auVar29._0_16_,ZEXT416((uint)local_33c));
    iVar10 = iVar10 + 1;
  } while (iVar10 != 0x33f);
  fVar27 = auVar28._0_4_ / 106.856895;
  auVar30 = ZEXT1664(CONCAT124(auVar28._4_12_,fVar27));
  fVar27 = fVar27 / local_324;
  pDVar11 = &local_2f8->illuminant;
  pFVar9 = local_158;
  lVar4 = 0;
  do {
    auVar31 = auVar30._8_56_;
    local_2d0.
    super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
    .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
             )(&swatchReflectances)[lVar4];
    local_2e0.
    super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
    .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
             )(Spectra::x | 0x2000000000000);
    local_2e8.
    super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
    .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
             )(Spectra::y | 0x2000000000000);
    local_2f0.
    super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
    .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
             )(Spectra::z | 0x2000000000000);
    local_2d8.
    super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
    .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
             )(TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
               )((ulong)pDVar11 | 0x2000000000000);
    XVar35 = ProjectReflectance<pbrt::XYZ>(&local_2d0,&local_2d8,&local_2e0,&local_2e8,&local_2f0);
    auVar30._0_8_ = XVar35._0_8_;
    auVar30._8_56_ = auVar31;
    auVar28 = vmovshdup_avx(auVar30._0_16_);
    lVar5 = 0;
    do {
      fVar33 = XVar35.X;
      if (((int)lVar5 != 0) && (fVar33 = auVar28._0_4_, (int)lVar5 != 1)) {
        fVar33 = XVar35.Z;
      }
      pFVar9[lVar5] = fVar27 * fVar33;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 3);
    lVar4 = lVar4 + 1;
    pFVar9 = pFVar9 + 3;
  } while (lVar4 != 0x18);
  LinearLeastSquares<3>
            ((optional<pbrt::SquareMatrix<3>_> *)&local_320.__align,(Float (*) [3])local_278,
             (Float (*) [3])local_158,0x18);
  if (local_2fc != '\0') {
    (local_348->XYZFromSensorRGB).m[2][2] = (Float)local_320._32_4_;
    *(undefined8 *)(local_348->XYZFromSensorRGB).m[0] = local_320._0_8_;
    *(undefined8 *)((local_348->XYZFromSensorRGB).m[0] + 2) = local_320._8_8_;
    *(undefined8 *)((local_348->XYZFromSensorRGB).m[1] + 1) = local_320._16_8_;
    *(undefined8 *)(local_348->XYZFromSensorRGB).m[2] = local_320._24_8_;
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&local_2a0.values);
    return;
  }
  ErrorExit<>("Sensor XYZ from RGB matrix could not be solved.");
}

Assistant:

PixelSensor(SpectrumHandle r, SpectrumHandle g, SpectrumHandle b,
                const RGBColorSpace *outputColorSpace, Float wbTemp, Float imagingRatio,
                Allocator alloc)
        : r_bar(r, alloc), g_bar(g, alloc), b_bar(b, alloc), imagingRatio(imagingRatio) {
        // Compute XYZ from camera RGB matrix
        // Compute _rgbCamera_ values for training swatches
        DenselySampledSpectrum sensorIllum = Spectra::D(wbTemp, alloc);
        Float rgbCamera[nSwatchReflectances][3];
        for (int i = 0; i < nSwatchReflectances; ++i) {
            RGB rgb = ProjectReflectance<RGB>(swatchReflectances[i], &sensorIllum, &r_bar,
                                              &g_bar, &b_bar);
            for (int c = 0; c < 3; ++c)
                rgbCamera[i][c] = rgb[c];
        }

        // Compute _xyzOutput_ values for training swatches
        Float xyzOutput[24][3];
        Float sensorWhiteG = InnerProduct(&sensorIllum, &g_bar);
        Float sensorWhiteY = InnerProduct(&sensorIllum, &Spectra::Y());
        for (size_t i = 0; i < nSwatchReflectances; ++i) {
            SpectrumHandle s = swatchReflectances[i];
            XYZ xyz =
                ProjectReflectance<XYZ>(s, &outputColorSpace->illuminant, &Spectra::X(),
                                        &Spectra::Y(), &Spectra::Z()) *
                (sensorWhiteY / sensorWhiteG);
            for (int c = 0; c < 3; ++c)
                xyzOutput[i][c] = xyz[c];
        }

        // Initialize _XYZFromSensorRGB_ using linear least squares
        pstd::optional<SquareMatrix<3>> m =
            LinearLeastSquares<3>(rgbCamera, xyzOutput, nSwatchReflectances);
        if (!m)
            ErrorExit("Sensor XYZ from RGB matrix could not be solved.");
        XYZFromSensorRGB = *m;
    }